

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::
EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard_Test::TestBody
          (EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard_Test
           *this)

{
  FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_00;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_01;
  ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *impl;
  PileId local_54;
  PileId local_50;
  PileId local_4c;
  _Any_data local_48;
  code *local_38;
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  local_28;
  
  local_48._M_unused._M_object = (void *)0x3300000018;
  local_48._M_pod_data[8] = '\x01';
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)&local_48);
  EventsProcessorTests::ignoreLeftButtonDownOnButtons(&this->super_EventsProcessorTests);
  EventsProcessorTests::ignoreLeftButtonDownOnFoundationPilesFromFirstTo
            (&this->super_EventsProcessorTests,4);
  EventsProcessorTests::ignoreLeftButtonDownOnTableauPilesFromFirstTo
            (&this->super_EventsProcessorTests,6);
  local_4c.t = (anonymous_namespace)::lastTableauPileId;
  EventsProcessorTests::acceptLeftButtonDownOnTableauPileCard
            (&this->super_EventsProcessorTests,&local_4c,2,
             (MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent);
  local_50.t = (anonymous_namespace)::lastTableauPileId;
  EventsProcessorTests::expectGetTableauPileAndItsCollider
            (&this->super_EventsProcessorTests,&local_50);
  this_00 = &(this->super_EventsProcessorTests).tableauPileMock.super_TableauPileMock.
             gmock10_getCards_17;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,
             &(this->super_EventsProcessorTests).tableauPileMock);
  local_28.function_mocker_ = this_00;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      (&local_28,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x142,"tableauPileMock","getCards()");
  impl = (ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0031e3b0;
  impl[1]._vptr_ActionInterface = (_func_int **)(anonymous_namespace)::cards;
  testing::
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
  Action((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
          *)&local_48,impl);
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_01,(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_54.t = (anonymous_namespace)::lastTableauPileId;
  EventsProcessorTests::expectTryPullOutCardsFromTableauPile
            (&this->super_EventsProcessorTests,
             (MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent,&local_54,2,
             (int)((ulong)((anonymous_namespace)::cards._8_8_ - (anonymous_namespace)::cards._0_8_)
                  >> 3) - 2);
  local_48._M_pod_data[8] = '\x04';
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)&local_48);
  EventsProcessor::processEvents(&(this->super_EventsProcessorTests).eventsProcessor);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount);
    ignoreLeftButtonDownOnTableauPilesFromFirstTo(tableauPilesCount - 1);
    acceptLeftButtonDownOnTableauPileCard(
        lastTableauPileId, middleTableauPileCardIndex, mouseLeftButtonDownEvent);
    expectGetTableauPileAndItsCollider(lastTableauPileId);
    EXPECT_CALL(tableauPileMock, getCards()).WillOnce(ReturnRef(cards));
    expectTryPullOutCardsFromTableauPile(
        mouseLeftButtonDownEvent, lastTableauPileId,
        middleTableauPileCardIndex, cards.size() - middleTableauPileCardIndex);
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}